

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_UnblindTx_VerifySignatureTest_Test::TestBody
          (cfdcapi_elements_transaction_UnblindTx_VerifySignatureTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *str_buffer;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *invalid_pubkey;
  int64_t satoshi;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  undefined1 in_stack_0000025f;
  char *in_stack_00000260;
  char *in_stack_00000268;
  char *in_stack_00000270;
  char *in_stack_00000278;
  char *in_stack_00000280;
  void *in_stack_00000288;
  uint32_t in_stack_000002a0;
  int in_stack_000002a8;
  int64_t in_stack_000002b8;
  char *in_stack_000002c0;
  int in_stack_000002c8;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffdcc;
  char *in_stack_fffffffffffffdd0;
  void **in_stack_fffffffffffffdd8;
  char *lhs_expression;
  void *in_stack_fffffffffffffdf8;
  AssertionResult *this_00;
  char **in_stack_fffffffffffffe50;
  AssertionResult *in_stack_fffffffffffffe58;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  AssertionResult local_110;
  char *local_100;
  AssertHelper local_f8;
  Message local_f0;
  undefined4 local_e4;
  AssertionResult local_e0;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  AssertionResult local_b8;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffdd8);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             (int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x364b0a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x686,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x364b6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x364bc2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (bool *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),(type *)0x364bf6)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x687,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x364cf2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x364d6d);
  if (local_14 == 0) {
    local_a0 = (char *)0x3b9aca00;
    local_a8 = "024c2f5d47dc96d470f55752ec3edb3b25c15bd5c17be6b73a97f3b3a928cc41fd";
    pcVar2 = (char *)0x3b9aca00;
    lhs_expression = (char *)0x0;
    uVar4 = 0;
    uVar3 = 1;
    local_14 = CfdVerifyConfidentialTxSignature
                         (in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270,
                          in_stack_00000268,in_stack_00000260,in_stack_000002a0,in_stack_000002a8,
                          (bool)in_stack_0000025f,in_stack_000002b8,in_stack_000002c0,
                          in_stack_000002c8);
    local_bc = 7;
    in_stack_fffffffffffffe58 = &local_b8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (lhs_expression,pcVar2,(CfdErrorCode *)CONCAT44(in_stack_fffffffffffffdcc,uVar4),
               (int *)CONCAT44(in_stack_fffffffffffffdc4,uVar3));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe58);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      in_stack_fffffffffffffe50 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x364eab);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x690,(char *)in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message((Message *)0x364f0e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x364f66);
    in_stack_fffffffffffffdd8 = (void **)0x0;
    in_stack_fffffffffffffdc8 = 0;
    in_stack_fffffffffffffdc0 = 1;
    in_stack_fffffffffffffdd0 = local_a0;
    local_14 = CfdVerifyConfidentialTxSignature
                         (in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270,
                          in_stack_00000268,in_stack_00000260,in_stack_000002a0,in_stack_000002a8,
                          (bool)in_stack_0000025f,in_stack_000002b8,in_stack_000002c0,
                          in_stack_000002c8);
    local_e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               (int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36507a);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x696,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message((Message *)0x3650dd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x365132);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffdf8);
  if (local_14 != 0) {
    local_100 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    local_114 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               (int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36521f);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x69d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x36527c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3652d1);
    testing::internal::CmpHelperSTREQ((internal *)&local_138,"\"\"","str_buffer","",local_100);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x365366);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x69e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x3653c3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x365418);
    CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_100 = (char *)0x0;
  }
  local_14 = CfdFreeHandle((void *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  local_15c = 0;
  this_00 = &local_158;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             (int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3654e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x6a4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message((Message *)0x365545);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36559a);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, UnblindTx_VerifySignatureTest) {
  static const char* const kTxHex = "02000000000117c10bbfcd4e89f6c33864ed627aa113f249343f4b2bbe6e86dcc725e0d06cfc010000006a473044022038527c96efaaa29b862c8fe8aa4e96602b03035505ebe1f166dd8b9f3731b7b502207e75d937ca1bb2e2f4208618051eb8aad02ad88a71477d7a6e7ec257f72cb6500121036b70f6598ee5c00ad068c9b86c7a1d5c433767a46db3bc3f9d53417171db1782fdffffff0301bdc7073c43d37ace6b66b02268ece4754fe6c39a985a16ccbe6cf05b89014d7201000000001dcd6500001976a91479975e7d3775b748cbcd5500804518280a2ebbae88ac01bdc7073c43d37ace6b66b02268ece4754fe6c39a985a16ccbe6cf05b89014d7201000000001dcccde80017a9141cd92b989652fbc4c2a92eb1d56456d0ef17d4158701bdc7073c43d37ace6b66b02268ece4754fe6c39a985a16ccbe6cf05b89014d7201000000000000971800000a000000";
  static const char* const kSignature = "62fb98d01be75290a782acf16332e30b23a867826717326620fa521134643b65477c8821722b55c46f4b06e379743f66e96bf848c4bd8664b3244a53920baefc";
  static const char* const kPubkey = "02f8b92edfdac52ab1f081d3caac42b76226d87d828a8e601a3f7ac06441c6a03a";
  // static const char* const kPrivkey = "cQ4oy4iVosJYxNxjdKFEtR6RZxWGx8doFPhNWZRd31g9fVuiQVi3";
  static const char* const kTxid = "fc6cd0e025c7dc866ebe2b4b3f3449f213a17a62ed6438c3f6894ecdbf0bc117";
  static const uint32_t kVout = 1;

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  if (ret == kCfdSuccess) {
    // Verification Error Case
    int64_t satoshi = 1000000000;
    const char* invalid_pubkey = "024c2f5d47dc96d470f55752ec3edb3b25c15bd5c17be6b73a97f3b3a928cc41fd";
    ret = CfdVerifyConfidentialTxSignature(handle, kTxHex, kSignature,
        invalid_pubkey, NULL, kTxid, kVout, CfdSighashType::kCfdSigHashAll,
        false, satoshi, NULL, CfdWitnessVersion::kCfdWitnessVersionNone);
    EXPECT_EQ(kCfdSignVerificationError, ret);

    // Verification Success Case
    ret = CfdVerifyConfidentialTxSignature(handle, kTxHex, kSignature, kPubkey,
        NULL, kTxid, kVout, CfdSighashType::kCfdSigHashAll, false, satoshi,
        NULL, CfdWitnessVersion::kCfdWitnessVersionNone);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}